

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::AMFImporter::CanRead(AMFImporter *this,string *pFile,IOSystem *pIOHandler,bool pCheckSig)

{
  bool bVar1;
  long lVar2;
  char *local_68;
  char *tokens [1];
  undefined1 local_50 [8];
  string extension;
  bool pCheckSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  AMFImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = pCheckSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"amf");
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
      local_68 = "<amf";
      this_local._7_1_ =
           BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_68,1,200,false,false);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool AMFImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool pCheckSig) const
{
    const std::string extension = GetExtension(pFile);

    if ( extension == "amf" ) {
        return true;
    }

	if(!extension.length() || pCheckSig)
	{
		const char* tokens[] = { "<amf" };

		return SearchFileHeaderForToken( pIOHandler, pFile, tokens, 1 );
	}

	return false;
}